

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O1

void HistogramSetResetPointers(VP8LHistogramSet *set,int cache_bits)

{
  long lVar1;
  VP8LHistogram **ppVVar2;
  VP8LHistogram *pVVar3;
  long lVar4;
  int iVar5;
  
  lVar1 = (long)set->max_size;
  if (0 < lVar1) {
    ppVVar2 = set->histograms + lVar1;
    iVar5 = (4 << ((byte)cache_bits & 0x1f)) + 0x1150;
    if (cache_bits < 1) {
      iVar5 = 0x1150;
    }
    lVar4 = 0;
    do {
      pVVar3 = (VP8LHistogram *)((long)ppVVar2 + 0x1fU & 0xffffffffffffffe0);
      set->histograms[lVar4] = pVVar3;
      set->histograms[lVar4]->literal = (uint32_t *)(pVVar3 + 1);
      ppVVar2 = (VP8LHistogram **)((long)pVVar3->red + (long)iVar5 + -8);
      lVar4 = lVar4 + 1;
    } while (lVar1 != lVar4);
  }
  return;
}

Assistant:

static void HistogramSetResetPointers(VP8LHistogramSet* const set,
                                      int cache_bits) {
  int i;
  const int histo_size = GetHistogramSize(cache_bits);
  uint8_t* memory = (uint8_t*) (set->histograms);
  memory += set->max_size * sizeof(*set->histograms);
  for (i = 0; i < set->max_size; ++i) {
    memory = (uint8_t*) WEBP_ALIGN(memory);
    set->histograms[i] = (VP8LHistogram*) memory;
    // 'literal' won't necessary be aligned.
    set->histograms[i]->literal = (uint32_t*)(memory + sizeof(VP8LHistogram));
    memory += histo_size;
  }
}